

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O0

void __thiscall CScript::CScript(CScript *this,opcodetype b)

{
  long in_FS_OFFSET;
  CScript *unaff_retaddr;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffffc8;
  long lVar1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(in_stack_ffffffffffffffc8);
  operator<<(unaff_retaddr,(opcodetype)((ulong)lVar1 >> 0x20));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit CScript(opcodetype b)     { operator<<(b); }